

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStream.hh
# Opt level: O1

void __thiscall avro::istream::~istream(istream *this)

{
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x1dc670;
  *(undefined8 *)&(this->super_istream).field_0x88 = 0x1dc698;
  *(undefined ***)&(this->super_istream).field_0x10 = &PTR__istreambuf_001dc720;
  boost::detail::shared_count::~shared_count((shared_count *)&(this->super_istream).field_0x58);
  *(code **)&(this->super_istream).field_0x10 = sysconf;
  std::locale::~locale((locale *)&(this->super_istream).field_0x48);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x1dc6c0;
  *(undefined8 *)&(this->super_istream).field_0x88 = 0x1dc6e8;
  (this->super_istream)._M_gcount = 0;
  std::ios_base::~ios_base((ios_base *)&(this->super_istream).field_0x88);
  operator_delete(this,400);
  return;
}

Assistant:

class AVRO_DECL istream : public std::istream {

  public:

    /// Constructor, requires an InputBuffer to read from.
    explicit istream(const InputBuffer &buf) : 
        std::istream(&ibuf_), ibuf_(buf)
    { }

    /// Constructor, takes an OutputBuffer to read from (by making a shallow copy to an InputBuffer).
    /// Writing to the OutputBuffer while an istream is using it may lead to undefined behavior.
    explicit istream(const OutputBuffer &buf) : 
        std::istream(&ibuf_), ibuf_(buf)
    { }

    /// Return the InputBuffer this stream is reading from.
    const InputBuffer &getBuffer() const {
        return ibuf_.getBuffer();
    }

  protected:

    istreambuf ibuf_;
}